

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

float getSpline(Spline *sp,float *vals)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Spline *in_RSI;
  int *in_RDI;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  float r;
  float q;
  float p;
  float o;
  float n;
  float m;
  float l;
  float k;
  float h;
  float g;
  Spline *sp2;
  Spline *sp1;
  float v;
  int i;
  float f;
  int iVar10;
  float local_4;
  
  if (((in_RDI != (int *)0x0) && (0 < *in_RDI)) && (*in_RDI < 0xc)) {
    if (*in_RDI == 1) {
      local_4 = (float)in_RDI[1];
    }
    else {
      fVar7 = in_RSI->loc[(long)in_RDI[1] + -2];
      iVar10 = 0;
      while ((iVar10 < *in_RDI && ((float)in_RDI[(long)iVar10 + 2] < fVar7))) {
        iVar10 = iVar10 + 1;
      }
      if ((iVar10 == 0) || (iVar10 == *in_RDI)) {
        if (iVar10 != 0) {
          iVar10 = iVar10 + -1;
        }
        local_4 = getSpline(in_RSI,(float *)CONCAT44(fVar7,iVar10));
        local_4 = (float)in_RDI[(long)iVar10 + 0xe] * (fVar7 - (float)in_RDI[(long)iVar10 + 2]) +
                  local_4;
      }
      else {
        fVar1 = (float)in_RDI[(long)(iVar10 + -1) + 2];
        fVar2 = (float)in_RDI[(long)iVar10 + 2];
        fVar5 = (fVar7 - fVar1) / (fVar2 - fVar1);
        fVar3 = (float)in_RDI[(long)(iVar10 + -1) + 0xe];
        fVar4 = (float)in_RDI[(long)iVar10 + 0xe];
        fVar6 = getSpline(in_RSI,(float *)CONCAT44(fVar7,iVar10));
        fVar7 = getSpline(in_RSI,(float *)CONCAT44(fVar7,iVar10));
        dVar8 = lerp((double)fVar5,(double)fVar6,(double)fVar7);
        dVar9 = lerp((double)fVar5,(double)(fVar3 * (fVar2 - fVar1) + -(fVar7 - fVar6)),
                     (double)(-fVar4 * (fVar2 - fVar1) + (fVar7 - fVar6)));
        local_4 = (float)((double)(fVar5 * (1.0 - fVar5)) * dVar9 + dVar8);
      }
    }
    return local_4;
  }
  printf("getSpline(): bad parameters\n");
  exit(1);
}

Assistant:

float getSpline(const Spline *sp, const float *vals)
{
    if (!sp || sp->len <= 0 || sp->len >= 12)
    {
        printf("getSpline(): bad parameters\n");
        exit(1);
    }

    if (sp->len == 1)
        return ((FixSpline*)sp)->val;

    float f = vals[sp->typ];
    int i;

    for (i = 0; i < sp->len; i++)
        if (sp->loc[i] >= f)
            break;
    if (i == 0 || i == sp->len)
    {
        if (i) i--;
        float v = getSpline(sp->val[i], vals);
        return v + sp->der[i] * (f - sp->loc[i]);
    }
    const Spline *sp1 = sp->val[i-1];
    const Spline *sp2 = sp->val[i];
    float g = sp->loc[i-1];
    float h = sp->loc[i];
    float k = (f - g) / (h - g);
    float l = sp->der[i-1];
    float m = sp->der[i];
    float n = getSpline(sp1, vals);
    float o = getSpline(sp2, vals);
    float p = l * (h - g) - (o - n);
    float q = -m * (h - g) + (o - n);
    float r = lerp(k, n, o) + k * (1.0F - k) * lerp(k, p, q);
    return r;
}